

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::FmaCase::getInputValues(FmaCase *this,int numValues,void **values)

{
  undefined4 uVar1;
  float fVar2;
  Precision precision;
  pointer pSVar3;
  void *pvVar4;
  deUint32 dVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  Vec2 ranges [3];
  Random rnd;
  long local_88;
  long local_80;
  float local_58 [6];
  deRandom local_40;
  
  local_58[0] = -2.0;
  local_58[1] = 2.0;
  local_58[2] = -127.0;
  local_58[3] = 127.0;
  local_58[4] = -1e+07;
  local_58[5] = 1e+07;
  dVar5 = deStringHash((this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar5 ^ 0xac23f);
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  precision = (pSVar3->varType).m_data.basic.precision;
  uVar6 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  iVar7 = 0;
  lVar8 = 0;
  do {
    lVar10 = 0;
    do {
      if (0 < (int)uVar6) {
        uVar1 = (&DAT_01c956a0)[lVar8 * 3 + lVar10];
        pvVar4 = values[lVar10];
        uVar11 = (ulong)uVar6;
        iVar12 = iVar7;
        do {
          *(undefined4 *)((long)pvVar4 + (long)iVar12 * 4) = uVar1;
          iVar12 = iVar12 + 1;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar8 = lVar8 + 1;
    iVar7 = iVar7 + uVar6;
  } while (lVar8 != 10);
  uVar9 = (numValues + -10) * uVar6;
  fVar15 = local_58[(ulong)precision * 2];
  local_80 = 0;
  do {
    if (0 < (int)uVar9) {
      pvVar4 = values[local_80];
      fVar2 = local_58[(ulong)precision * 2 + 1];
      uVar11 = 0;
      do {
        fVar14 = deRandom_getFloat(&local_40);
        *(float *)((long)pvVar4 + uVar11 * 4 + (long)(int)(uVar6 * 10) * 4) =
             fVar14 * (fVar2 - fVar15) + fVar15;
        uVar11 = uVar11 + 1;
      } while (uVar9 != uVar11);
    }
    local_80 = local_80 + 1;
  } while (local_80 != 3);
  local_88 = 0;
  do {
    if (0 < numValues) {
      iVar7 = 0;
      iVar12 = 0;
      do {
        if (0 < (int)uVar6) {
          pvVar4 = values[local_88];
          uVar11 = (ulong)uVar6;
          iVar13 = iVar7;
          do {
            fVar15 = makeFloatRepresentable(*(float *)((long)pvVar4 + (long)iVar13 * 4),precision);
            *(float *)((long)pvVar4 + (long)iVar13 * 4) = fVar15;
            iVar13 = iVar13 + 1;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        iVar12 = iVar12 + 1;
        iVar7 = iVar7 + uVar6;
      } while (iVar12 != numValues);
    }
    local_88 = local_88 + 1;
  } while (local_88 != 3);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-127.f,	127.f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd							(deStringHash(getName()) ^ 0xac23fu);
		const glu::DataType		type						= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision					= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize					= glu::getDataTypeScalarSize(type);
		const float				specialCases[][3]			=
		{
			// a		b		c
			{ 0.0f,		0.0f,	0.0f },
			{ 0.0f,		1.0f,	0.0f },
			{ 0.0f,		0.0f,	-1.0f },
			{ 1.0f,		1.0f,	0.0f },
			{ 1.0f,		1.0f,	1.0f },
			{ -1.0f,	1.0f,	0.0f },
			{ 1.0f,		-1.0f,	0.0f },
			{ -1.0f,	-1.0f,	0.0f },
			{ -0.0f,	1.0f,	0.0f },
			{ 1.0f,		-0.0f,	0.0f }
		};
		const int				numSpecialCases				= DE_LENGTH_OF_ARRAY(specialCases);

		// Special cases
		for (int caseNdx = 0; caseNdx < numSpecialCases; caseNdx++)
		{
			for (int inputNdx = 0; inputNdx < 3; inputNdx++)
			{
				for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
					((float*)values[inputNdx])[caseNdx*scalarSize + scalarNdx] = specialCases[caseNdx][inputNdx];
			}
		}

		// Random cases.
		{
			const int	numScalars	= (numValues-numSpecialCases)*scalarSize;
			const int	offs		= scalarSize*numSpecialCases;

			for (int inputNdx = 0; inputNdx < 3; inputNdx++)
				fillRandomScalars(rnd, ranges[precision].x(), ranges[precision].y(), (float*)values[inputNdx] + offs, numScalars);
		}

		// Make sure the values are representable in the target format
		for (int inputNdx = 0; inputNdx < 3; inputNdx++)
		{
			for (int caseNdx = 0; caseNdx < numValues; ++caseNdx)
			{
				for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
				{
					float* const valuePtr = &((float*)values[inputNdx])[caseNdx * scalarSize + scalarNdx];

					*valuePtr = makeFloatRepresentable(*valuePtr, precision);
				}
			}
		}
	}